

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::insert
          (IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *this,unsigned_long left,
          unsigned_long right,ValueDriver **value,allocator_type *alloc)

{
  bool bVar1;
  uint32_t uVar2;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *in_RDI;
  iterator it;
  uint32_t i;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *in_stack_ffffffffffffff48;
  ValueDriver **in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *in_stack_ffffffffffffff70;
  allocator_type *in_stack_ffffffffffffffb0;
  ValueDriver **in_stack_ffffffffffffffb8;
  unsigned_long in_stack_ffffffffffffffc0;
  unsigned_long in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar1 = isFlat(in_RDI);
  if ((bVar1) && (in_RDI->rootSize != 8)) {
    IntervalMapDetails::
    NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
    ::find((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
            *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
           (interval<unsigned_long> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
    ;
    uVar2 = IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>::
            insertFrom((LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true> *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
                       (interval<unsigned_long> *)in_RDI,in_stack_ffffffffffffff50);
    in_RDI->rootSize = uVar2;
  }
  else {
    iterator::iterator((iterator *)&stack0xffffffffffffff70,in_stack_ffffffffffffff48);
    const_iterator::setToFind
              ((const_iterator *)in_stack_ffffffffffffff70,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    iterator::insert((iterator *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb0);
    iterator::~iterator((iterator *)0x7f071b);
  }
  return;
}

Assistant:

void insert(TKey left, TKey right, const TValue& value, allocator_type& alloc) {
        if (isFlat() && rootSize != RootLeaf::Capacity) {
            uint32_t i = rootLeaf.find(rootSize, {left, right});
            rootSize = rootLeaf.insertFrom(i, rootSize, {left, right}, value);
        }
        else {
            iterator it(*this);
            it.setToFind(left, right);
            it.insert(left, right, value, alloc);
        }
    }